

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_5d835d::Db::parseBaseUnresolvedName(Db *this)

{
  short *psVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  short *psVar5;
  
  psVar5 = (short *)this->First;
  psVar1 = (short *)this->Last;
  if ((psVar1 != psVar5) && ((int)(char)*psVar5 - 0x30U < 10)) {
    pNVar2 = parseSimpleId(this);
    return pNVar2;
  }
  if (1 < (ulong)((long)psVar1 - (long)psVar5)) {
    if (*psVar5 == 0x6e64) {
      psVar5 = psVar5 + 1;
      this->First = (char *)psVar5;
      if ((psVar1 == psVar5) || (9 < (int)(char)*psVar5 - 0x30U)) {
        pNVar2 = parseUnresolvedType(this);
      }
      else {
        pNVar2 = parseSimpleId(this);
      }
      if (pNVar2 != (Node *)0x0) {
        pNVar3 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
        pNVar3->K = KDtorName;
        pNVar3->RHSComponentCache = No;
        pNVar3->ArrayCache = No;
        pNVar3->FunctionCache = No;
        pNVar3->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023dd60;
        pNVar3[1]._vptr_Node = (_func_int **)pNVar2;
        return pNVar3;
      }
      return (Node *)0x0;
    }
    if (*psVar5 == 0x6e6f) {
      this->First = (char *)(psVar5 + 1);
    }
  }
  pNVar3 = parseOperatorName(this,(NameState *)0x0);
  pNVar2 = (Node *)0x0;
  if (((pNVar3 != (Node *)0x0) && (pNVar2 = pNVar3, this->Last != this->First)) &&
     (*this->First == 'I')) {
    pNVar4 = parseTemplateArgs(this,false);
    pNVar2 = (Node *)0x0;
    if (pNVar4 != (Node *)0x0) {
      pNVar2 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar2->K = KNameWithTemplateArgs;
      pNVar2->RHSComponentCache = No;
      pNVar2->ArrayCache = No;
      pNVar2->FunctionCache = No;
      pNVar2->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023e650;
      pNVar2[1]._vptr_Node = (_func_int **)pNVar3;
      *(Node **)&pNVar2[1].K = pNVar4;
    }
  }
  return pNVar2;
}

Assistant:

Node *Db::parseBaseUnresolvedName() {
  if (std::isdigit(look()))
    return parseSimpleId();

  if (consumeIf("dn"))
    return parseDestructorName();

  consumeIf("on");

  Node *Oper = parseOperatorName(/*NameState=*/nullptr);
  if (Oper == nullptr)
    return nullptr;
  if (look() == 'I') {
    Node *TA = parseTemplateArgs();
    if (TA == nullptr)
      return nullptr;
    return make<NameWithTemplateArgs>(Oper, TA);
  }
  return Oper;
}